

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void preptypeinfo(rnndb *db,rnntypeinfo *ti,char *prefix,rnnvarinfo *vi,int width,char *file)

{
  int iVar1;
  rnnenum *prVar2;
  rnnbitset *prVar3;
  rnnspectype *prVar4;
  rnnvalue **pprVar5;
  rnnvalue *prVar6;
  rnnbitfield **pprVar7;
  rnnbitfield *prVar8;
  char *pcVar9;
  int local_60;
  int local_5c;
  int j_1;
  int j;
  rnnspectype *st;
  rnnbitset *bs;
  rnnenum *en;
  int i;
  char *file_local;
  int width_local;
  rnnvarinfo *vi_local;
  char *prefix_local;
  rnntypeinfo *ti_local;
  rnndb *db_local;
  
  if (ti->name == (char *)0x0) {
    if (ti->bitfieldsnum == 0) {
      if (ti->valsnum == 0) {
        if (width == 1) {
          pcVar9 = strdup("boolean");
          ti->name = pcVar9;
          ti->type = RNN_TTYPE_BOOLEAN;
        }
        else {
          pcVar9 = strdup("hex");
          ti->name = pcVar9;
          ti->type = RNN_TTYPE_HEX;
        }
      }
      else {
        pcVar9 = strdup("enum");
        ti->name = pcVar9;
        ti->type = RNN_TTYPE_INLINE_ENUM;
      }
    }
    else {
      pcVar9 = strdup("bitfield");
      ti->name = pcVar9;
      ti->type = RNN_TTYPE_INLINE_BITSET;
    }
  }
  else {
    prVar2 = rnn_findenum(db,ti->name);
    prVar3 = rnn_findbitset(db,ti->name);
    prVar4 = rnn_findspectype(db,ti->name);
    if (prVar2 == (rnnenum *)0x0) {
      if (prVar3 == (rnnbitset *)0x0) {
        if (prVar4 == (rnnspectype *)0x0) {
          iVar1 = strcmp(ti->name,"hex");
          if (iVar1 == 0) {
            ti->type = RNN_TTYPE_HEX;
          }
          else {
            iVar1 = strcmp(ti->name,"float");
            if (iVar1 == 0) {
              ti->type = RNN_TTYPE_FLOAT;
            }
            else {
              iVar1 = strcmp(ti->name,"uint");
              if (iVar1 == 0) {
                ti->type = RNN_TTYPE_UINT;
              }
              else {
                iVar1 = strcmp(ti->name,"int");
                if (iVar1 == 0) {
                  ti->type = RNN_TTYPE_INT;
                }
                else {
                  iVar1 = strcmp(ti->name,"boolean");
                  if (iVar1 == 0) {
                    ti->type = RNN_TTYPE_BOOLEAN;
                  }
                  else {
                    iVar1 = strcmp(ti->name,"bitfield");
                    if (iVar1 == 0) {
                      ti->type = RNN_TTYPE_INLINE_BITSET;
                    }
                    else {
                      iVar1 = strcmp(ti->name,"enum");
                      if (iVar1 == 0) {
                        ti->type = RNN_TTYPE_INLINE_ENUM;
                      }
                      else {
                        iVar1 = strcmp(ti->name,"fixed");
                        if (iVar1 == 0) {
                          ti->type = RNN_TTYPE_FIXED;
                        }
                        else {
                          iVar1 = strcmp(ti->name,"ufixed");
                          if (iVar1 == 0) {
                            ti->type = RNN_TTYPE_UFIXED;
                          }
                          else {
                            ti->type = RNN_TTYPE_HEX;
                            fprintf(_stderr,"%s: unknown type %s\n",prefix,ti->name);
                            db->estatus = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          ti->type = RNN_TTYPE_SPECTYPE;
          ti->spectype = prVar4;
        }
      }
      else if (prVar3->isinline == 0) {
        ti->type = RNN_TTYPE_BITSET;
        ti->ebitset = prVar3;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_BITSET;
        for (local_60 = 0; local_60 < prVar3->bitfieldsnum; local_60 = local_60 + 1) {
          if (ti->bitfieldsmax <= ti->bitfieldsnum) {
            if (ti->bitfieldsmax == 0) {
              ti->bitfieldsmax = 0x10;
            }
            else {
              ti->bitfieldsmax = ti->bitfieldsmax << 1;
            }
            pprVar7 = (rnnbitfield **)realloc(ti->bitfields,(long)ti->bitfieldsmax << 3);
            ti->bitfields = pprVar7;
          }
          prVar8 = copybitfield(prVar3->bitfields[local_60],file);
          iVar1 = ti->bitfieldsnum;
          ti->bitfieldsnum = iVar1 + 1;
          ti->bitfields[iVar1] = prVar8;
        }
      }
    }
    else if (prVar2->isinline == 0) {
      ti->type = RNN_TTYPE_ENUM;
      ti->eenum = prVar2;
    }
    else {
      ti->type = RNN_TTYPE_INLINE_ENUM;
      for (local_5c = 0; local_5c < prVar2->valsnum; local_5c = local_5c + 1) {
        if (ti->valsmax <= ti->valsnum) {
          if (ti->valsmax == 0) {
            ti->valsmax = 0x10;
          }
          else {
            ti->valsmax = ti->valsmax << 1;
          }
          pprVar5 = (rnnvalue **)realloc(ti->vals,(long)ti->valsmax << 3);
          ti->vals = pprVar5;
        }
        prVar6 = copyvalue(prVar2->vals[local_5c],file);
        iVar1 = ti->valsnum;
        ti->valsnum = iVar1 + 1;
        ti->vals[iVar1] = prVar6;
      }
    }
  }
  for (en._4_4_ = 0; en._4_4_ < ti->bitfieldsnum; en._4_4_ = en._4_4_ + 1) {
    prepbitfield(db,ti->bitfields[en._4_4_],prefix,vi);
  }
  for (en._4_4_ = 0; en._4_4_ < ti->valsnum; en._4_4_ = en._4_4_ + 1) {
    prepvalue(db,ti->vals[en._4_4_],prefix,vi);
  }
  return;
}

Assistant:

static void preptypeinfo(struct rnndb *db, struct rnntypeinfo *ti, char *prefix, struct rnnvarinfo *vi, int width, char *file) {
	int i;
	if (ti->name) {
		struct rnnenum *en = rnn_findenum (db, ti->name);
		struct rnnbitset *bs = rnn_findbitset (db, ti->name);
		struct rnnspectype *st = rnn_findspectype (db, ti->name);
		if (en) {
			if (en->isinline) {
				ti->type = RNN_TTYPE_INLINE_ENUM;
				int j;
				for (j = 0; j < en->valsnum; j++)
					ADDARRAY(ti->vals, copyvalue(en->vals[j], file));
			} else {
				ti->type = RNN_TTYPE_ENUM;
				ti->eenum = en;
			}
		} else if (bs) {
			if (bs->isinline) {
				ti->type = RNN_TTYPE_INLINE_BITSET;
				int j;
				for (j = 0; j < bs->bitfieldsnum; j++)
					ADDARRAY(ti->bitfields, copybitfield(bs->bitfields[j], file));
			} else {
				ti->type = RNN_TTYPE_BITSET;
				ti->ebitset = bs;
			}
		} else if (st) {
			ti->type = RNN_TTYPE_SPECTYPE;
			ti->spectype = st;
		} else if (!strcmp(ti->name, "hex")) {
			ti->type = RNN_TTYPE_HEX;
		} else if (!strcmp(ti->name, "float")) {
			ti->type = RNN_TTYPE_FLOAT;
		} else if (!strcmp(ti->name, "uint")) {
			ti->type = RNN_TTYPE_UINT;
		} else if (!strcmp(ti->name, "int")) {
			ti->type = RNN_TTYPE_INT;
		} else if (!strcmp(ti->name, "boolean")) {
			ti->type = RNN_TTYPE_BOOLEAN;
		} else if (!strcmp(ti->name, "bitfield")) {
			ti->type = RNN_TTYPE_INLINE_BITSET;
		} else if (!strcmp(ti->name, "enum")) {
			ti->type = RNN_TTYPE_INLINE_ENUM;
		} else if (!strcmp(ti->name, "fixed")) {
			ti->type = RNN_TTYPE_FIXED;
		} else if (!strcmp(ti->name, "ufixed")) {
			ti->type = RNN_TTYPE_UFIXED;
		} else {
			ti->type = RNN_TTYPE_HEX;
			fprintf (stderr, "%s: unknown type %s\n", prefix, ti->name);
			db->estatus = 1;
		}
	} else if (ti->bitfieldsnum) {
		ti->name = strdup("bitfield");
		ti->type = RNN_TTYPE_INLINE_BITSET;
	} else if (ti->valsnum) {
		ti->name = strdup("enum");
		ti->type = RNN_TTYPE_INLINE_ENUM;
	} else if (width == 1) {
		ti->name = strdup("boolean");
		ti->type = RNN_TTYPE_BOOLEAN;
	} else {
		ti->name = strdup("hex");
		ti->type = RNN_TTYPE_HEX;
	}
	for (i = 0; i < ti->bitfieldsnum; i++)
		prepbitfield(db,  ti->bitfields[i], prefix, vi);
	for (i = 0; i < ti->valsnum; i++)
		prepvalue(db, ti->vals[i], prefix, vi);
}